

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Host.cpp
# Opt level: O0

StringRef __thiscall
llvm::sys::detail::getHostCPUNameForPowerPC(detail *this,StringRef ProcCpuinfoContent)

{
  bool bVar1;
  const_iterator pcVar2;
  char **ppcVar3;
  StringLiteral local_e98;
  StringLiteral local_e88;
  StringLiteral local_e78;
  StringLiteral local_e68;
  StringLiteral local_e58;
  StringLiteral local_e48;
  StringLiteral local_e38;
  StringLiteral local_e28;
  StringLiteral local_e18;
  StringLiteral local_e08;
  StringLiteral local_df8;
  StringLiteral local_de8;
  StringLiteral local_dd8;
  StringLiteral local_dc8;
  StringLiteral local_db8;
  StringLiteral local_da8;
  StringLiteral local_d98;
  StringLiteral local_d88;
  StringLiteral local_d78 [2];
  void *local_d58;
  size_t local_d50;
  Optional<const_char_*> OStack_d48;
  size_t local_d38;
  size_t CPULen;
  const_iterator CPUStart;
  const_iterator CIP;
  const_iterator CPUInfoEnd;
  const_iterator CPUInfoStart;
  char *generic;
  StringRef ProcCpuinfoContent_local;
  char *local_c78;
  void **local_c70;
  char *local_c68;
  size_t local_c60;
  char *local_c58;
  size_t local_c50;
  void *local_c48;
  size_t local_c40;
  char *local_c38;
  void **local_c30;
  char *local_c28;
  size_t local_c20;
  char *local_c18;
  size_t local_c10;
  void *local_c08;
  size_t local_c00;
  char *local_bf8;
  void **local_bf0;
  char *local_be8;
  size_t local_be0;
  char *local_bd8;
  size_t local_bd0;
  void *local_bc8;
  size_t local_bc0;
  char *local_bb8;
  void **local_bb0;
  char *local_ba8;
  size_t local_ba0;
  char *local_b98;
  size_t local_b90;
  void *local_b88;
  size_t local_b80;
  char *local_b78;
  void **local_b70;
  char *local_b68;
  size_t local_b60;
  char *local_b58;
  size_t local_b50;
  void *local_b48;
  size_t local_b40;
  char *local_b38;
  void **local_b30;
  char *local_b28;
  size_t local_b20;
  char *local_b18;
  size_t local_b10;
  void *local_b08;
  size_t local_b00;
  char *local_af8;
  void **local_af0;
  char *local_ae8;
  size_t local_ae0;
  char *local_ad8;
  size_t local_ad0;
  void *local_ac8;
  size_t local_ac0;
  char *local_ab8;
  void **local_ab0;
  char *local_aa8;
  size_t local_aa0;
  char *local_a98;
  size_t local_a90;
  void *local_a88;
  size_t local_a80;
  char *local_a78;
  void **local_a70;
  char *local_a68;
  size_t local_a60;
  char *local_a58;
  size_t local_a50;
  void *local_a48;
  size_t local_a40;
  char *local_a38;
  void **local_a30;
  char *local_a28;
  size_t local_a20;
  char *local_a18;
  size_t local_a10;
  void *local_a08;
  size_t local_a00;
  char *local_9f8;
  void **local_9f0;
  char *local_9e8;
  size_t local_9e0;
  char *local_9d8;
  size_t local_9d0;
  void *local_9c8;
  size_t local_9c0;
  char *local_9b8;
  void **local_9b0;
  char *local_9a8;
  size_t local_9a0;
  char *local_998;
  size_t local_990;
  void *local_988;
  size_t local_980;
  char *local_978;
  void **local_970;
  char *local_968;
  size_t local_960;
  char *local_958;
  size_t local_950;
  void *local_948;
  size_t local_940;
  char *local_938;
  void **local_930;
  char *local_928;
  size_t local_920;
  char *local_918;
  size_t local_910;
  void *local_908;
  size_t local_900;
  char *local_8f8;
  void **local_8f0;
  char *local_8e8;
  size_t local_8e0;
  char *local_8d8;
  size_t local_8d0;
  void *local_8c8;
  size_t local_8c0;
  char *local_8b8;
  void **local_8b0;
  char *local_8a8;
  size_t local_8a0;
  char *local_898;
  size_t local_890;
  void *local_888;
  size_t local_880;
  char *local_878;
  void **local_870;
  char *local_868;
  size_t local_860;
  char *local_858;
  size_t local_850;
  void *local_848;
  size_t local_840;
  char *local_838;
  void **local_830;
  char *local_828;
  size_t local_820;
  char *local_818;
  size_t local_810;
  void *local_808;
  size_t local_800;
  char *local_7f8;
  void **local_7f0;
  char *local_7e8;
  size_t local_7e0;
  const_iterator local_7d8;
  void **local_7d0;
  const_iterator local_7c8;
  char *local_7c0;
  size_t local_7b8;
  char *local_7b0;
  size_t local_7a8;
  void *local_7a0;
  size_t local_798;
  char *local_790;
  size_t local_788;
  char *local_780;
  size_t local_778;
  void *local_770;
  size_t local_768;
  char *local_760;
  size_t local_758;
  char *local_750;
  size_t local_748;
  void *local_740;
  size_t local_738;
  char *local_730;
  size_t local_728;
  char *local_720;
  size_t local_718;
  void *local_710;
  size_t local_708;
  char *local_700;
  size_t local_6f8;
  char *local_6f0;
  size_t local_6e8;
  void *local_6e0;
  size_t local_6d8;
  char *local_6d0;
  size_t local_6c8;
  char *local_6c0;
  size_t local_6b8;
  void *local_6b0;
  size_t local_6a8;
  char *local_6a0;
  size_t local_698;
  char *local_690;
  size_t local_688;
  void *local_680;
  size_t local_678;
  char *local_670;
  size_t local_668;
  char *local_660;
  size_t local_658;
  void *local_650;
  size_t local_648;
  char *local_640;
  size_t local_638;
  char *local_630;
  size_t local_628;
  void *local_620;
  size_t local_618;
  char *local_610;
  size_t local_608;
  char *local_600;
  size_t local_5f8;
  void *local_5f0;
  size_t local_5e8;
  char *local_5e0;
  size_t local_5d8;
  char *local_5d0;
  size_t local_5c8;
  void *local_5c0;
  size_t local_5b8;
  char *local_5b0;
  size_t local_5a8;
  char *local_5a0;
  size_t local_598;
  void *local_590;
  size_t local_588;
  char *local_580;
  size_t local_578;
  char *local_570;
  size_t local_568;
  void *local_560;
  size_t local_558;
  char *local_550;
  size_t local_548;
  char *local_540;
  size_t local_538;
  void *local_530;
  size_t local_528;
  char *local_520;
  size_t local_518;
  char *local_510;
  size_t local_508;
  void *local_500;
  size_t local_4f8;
  char *local_4f0;
  size_t local_4e8;
  char *local_4e0;
  size_t local_4d8;
  void *local_4d0;
  size_t local_4c8;
  char *local_4c0;
  size_t local_4b8;
  char *local_4b0;
  size_t local_4a8;
  void *local_4a0;
  size_t local_498;
  char *local_490;
  size_t local_488;
  char *local_480;
  size_t local_478;
  void *local_470;
  size_t local_468;
  char *local_460;
  size_t local_458;
  char *local_450;
  size_t local_448;
  void *local_440;
  size_t local_438;
  void **local_430;
  char *local_428;
  size_t local_420;
  size_t local_418;
  char *local_410;
  void *local_408;
  int local_3fc;
  void **local_3f8;
  char *local_3f0;
  size_t local_3e8;
  size_t local_3e0;
  char *local_3d8;
  void *local_3d0;
  int local_3c4;
  void **local_3c0;
  char *local_3b8;
  size_t local_3b0;
  size_t local_3a8;
  char *local_3a0;
  void *local_398;
  int local_38c;
  void **local_388;
  char *local_380;
  size_t local_378;
  size_t local_370;
  char *local_368;
  void *local_360;
  int local_354;
  void **local_350;
  char *local_348;
  size_t local_340;
  size_t local_338;
  char *local_330;
  void *local_328;
  int local_31c;
  void **local_318;
  char *local_310;
  size_t local_308;
  size_t local_300;
  char *local_2f8;
  void *local_2f0;
  int local_2e4;
  void **local_2e0;
  char *local_2d8;
  size_t local_2d0;
  size_t local_2c8;
  char *local_2c0;
  void *local_2b8;
  int local_2ac;
  void **local_2a8;
  char *local_2a0;
  size_t local_298;
  size_t local_290;
  char *local_288;
  void *local_280;
  int local_274;
  void **local_270;
  char *local_268;
  size_t local_260;
  size_t local_258;
  char *local_250;
  void *local_248;
  int local_23c;
  void **local_238;
  char *local_230;
  size_t local_228;
  size_t local_220;
  char *local_218;
  void *local_210;
  int local_204;
  void **local_200;
  char *local_1f8;
  size_t local_1f0;
  size_t local_1e8;
  char *local_1e0;
  void *local_1d8;
  int local_1cc;
  void **local_1c8;
  char *local_1c0;
  size_t local_1b8;
  size_t local_1b0;
  char *local_1a8;
  void *local_1a0;
  int local_194;
  void **local_190;
  char *local_188;
  size_t local_180;
  size_t local_178;
  char *local_170;
  void *local_168;
  int local_15c;
  void **local_158;
  char *local_150;
  size_t local_148;
  size_t local_140;
  char *local_138;
  void *local_130;
  int local_124;
  void **local_120;
  char *local_118;
  size_t local_110;
  size_t local_108;
  char *local_100;
  void *local_f8;
  int local_ec;
  void **local_e8;
  char *local_e0;
  size_t local_d8;
  size_t local_d0;
  char *local_c8;
  void *local_c0;
  int local_b4;
  void **local_b0;
  char *local_a8;
  size_t local_a0;
  size_t local_98;
  char *local_90;
  void *local_88;
  int local_7c;
  void **local_78;
  char *local_70;
  size_t local_68;
  size_t local_60;
  char *local_58;
  void *local_50;
  int local_44;
  void **local_40;
  char *local_38;
  size_t local_30;
  size_t local_28;
  char *local_20;
  void *local_18;
  int local_c;
  
  ProcCpuinfoContent_local.Data = ProcCpuinfoContent.Data;
  CPUInfoStart = "generic";
  generic = (char *)this;
  CPUInfoEnd = StringRef::begin((StringRef *)&generic);
  CIP = StringRef::end((StringRef *)&generic);
  CPUStart = CPUInfoEnd;
  CPULen = 0;
  local_d38 = 0;
  while (CPUStart < CIP && CPULen == 0) {
    if ((CPUStart < CIP) && (*CPUStart == '\n')) {
      CPUStart = CPUStart + 1;
    }
    pcVar2 = CPUStart;
    if ((((CPUStart < CIP) && (*CPUStart == 'c')) && (pcVar2 = CPUStart + 1, pcVar2 < CIP)) &&
       (((*pcVar2 == 'p' && (pcVar2 = CPUStart + 2, pcVar2 < CIP)) && (*pcVar2 == 'u')))) {
      CPUStart = CPUStart + 3;
      while( true ) {
        bVar1 = false;
        if ((CPUStart < CIP) && (bVar1 = true, *CPUStart != ' ')) {
          bVar1 = *CPUStart == '\t';
        }
        if (!bVar1) break;
        CPUStart = CPUStart + 1;
      }
      pcVar2 = CPUStart;
      if ((CPUStart < CIP) && (*CPUStart == ':')) {
        do {
          CPUStart = CPUStart + 1;
          pcVar2 = CPUStart;
          bVar1 = false;
          if ((CPUStart < CIP) && (bVar1 = true, *CPUStart != ' ')) {
            bVar1 = *CPUStart == '\t';
          }
        } while (bVar1);
        if (CPUStart < CIP) {
          CPULen = (size_t)CPUStart;
          while( true ) {
            bVar1 = false;
            if ((((CPUStart < CIP) && (bVar1 = false, *CPUStart != ' ')) &&
                (bVar1 = false, *CPUStart != '\t')) && (bVar1 = false, *CPUStart != ',')) {
              bVar1 = *CPUStart != '\n';
            }
            if (!bVar1) break;
            CPUStart = CPUStart + 1;
          }
          local_d38 = (long)CPUStart - (long)pcVar2;
          pcVar2 = CPUStart;
        }
      }
    }
    CPUStart = pcVar2;
    if (CPULen == 0) {
      while( true ) {
        bVar1 = false;
        if (CPUStart < CIP) {
          bVar1 = *CPUStart != '\n';
        }
        if (!bVar1) break;
        CPUStart = CPUStart + 1;
      }
    }
  }
  if (CPULen == 0) {
    ProcCpuinfoContent_local.Length = (size_t)CPUInfoStart;
    if (CPUInfoStart != (const_iterator)0x0) {
      strlen(CPUInfoStart);
    }
  }
  else {
    local_d58 = (void *)CPULen;
    local_d50 = local_d38;
    Optional<const_char_*>::Optional(&OStack_d48);
    StringLiteral::StringLiteral<5UL>(local_d78,(char (*) [5])"604e");
    local_7e8 = local_d78[0].super_StringRef.Data;
    local_7e0 = local_d78[0].super_StringRef.Length;
    local_7f8 = "604e";
    local_7f0 = &local_d58;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
    if (!bVar1) {
      local_808 = local_d58;
      local_800 = local_d50;
      local_818 = local_7e8;
      local_810 = local_7e0;
      local_7b0 = local_7e8;
      local_7a8 = local_7e0;
      local_7c0 = local_7e8;
      local_7b8 = local_7e0;
      local_38 = local_7e8;
      local_30 = local_7e0;
      local_40 = &local_7a0;
      bVar1 = false;
      local_7a0 = local_808;
      local_798 = local_800;
      if (local_d50 == local_7e0) {
        local_18 = local_d58;
        local_20 = local_7e8;
        local_28 = local_7e0;
        if (local_7e0 == 0) {
          local_c = 0;
        }
        else {
          local_c = memcmp(local_d58,local_7e8,local_7e0);
        }
        bVar1 = local_c == 0;
      }
      if (bVar1) {
        Optional<const_char_*>::operator=(&OStack_d48,&local_7f8);
      }
    }
    StringLiteral::StringLiteral<4UL>(&local_d88,(char (*) [4])"604");
    local_828 = local_d88.super_StringRef.Data;
    local_820 = local_d88.super_StringRef.Length;
    local_838 = "604";
    local_830 = &local_d58;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
    if (!bVar1) {
      local_848 = local_d58;
      local_840 = local_d50;
      local_858 = local_828;
      local_850 = local_820;
      local_780 = local_828;
      local_778 = local_820;
      local_790 = local_828;
      local_788 = local_820;
      local_70 = local_828;
      local_68 = local_820;
      local_78 = &local_770;
      bVar1 = false;
      local_770 = local_848;
      local_768 = local_840;
      if (local_d50 == local_820) {
        local_50 = local_d58;
        local_58 = local_828;
        local_60 = local_820;
        if (local_820 == 0) {
          local_44 = 0;
        }
        else {
          local_44 = memcmp(local_d58,local_828,local_820);
        }
        bVar1 = local_44 == 0;
      }
      if (bVar1) {
        Optional<const_char_*>::operator=(&OStack_d48,&local_838);
      }
    }
    StringLiteral::StringLiteral<5UL>(&local_d98,(char (*) [5])"7400");
    local_868 = local_d98.super_StringRef.Data;
    local_860 = local_d98.super_StringRef.Length;
    local_878 = "7400";
    local_870 = &local_d58;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
    if (!bVar1) {
      local_888 = local_d58;
      local_880 = local_d50;
      local_898 = local_868;
      local_890 = local_860;
      local_750 = local_868;
      local_748 = local_860;
      local_760 = local_868;
      local_758 = local_860;
      local_a8 = local_868;
      local_a0 = local_860;
      local_b0 = &local_740;
      bVar1 = false;
      local_740 = local_888;
      local_738 = local_880;
      if (local_d50 == local_860) {
        local_88 = local_d58;
        local_90 = local_868;
        local_98 = local_860;
        if (local_860 == 0) {
          local_7c = 0;
        }
        else {
          local_7c = memcmp(local_d58,local_868,local_860);
        }
        bVar1 = local_7c == 0;
      }
      if (bVar1) {
        Optional<const_char_*>::operator=(&OStack_d48,&local_878);
      }
    }
    StringLiteral::StringLiteral<5UL>(&local_da8,(char (*) [5])"7410");
    local_8a8 = local_da8.super_StringRef.Data;
    local_8a0 = local_da8.super_StringRef.Length;
    local_8b8 = "7400";
    local_8b0 = &local_d58;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
    if (!bVar1) {
      local_8c8 = local_d58;
      local_8c0 = local_d50;
      local_8d8 = local_8a8;
      local_8d0 = local_8a0;
      local_720 = local_8a8;
      local_718 = local_8a0;
      local_730 = local_8a8;
      local_728 = local_8a0;
      local_e0 = local_8a8;
      local_d8 = local_8a0;
      local_e8 = &local_710;
      bVar1 = false;
      local_710 = local_8c8;
      local_708 = local_8c0;
      if (local_d50 == local_8a0) {
        local_c0 = local_d58;
        local_c8 = local_8a8;
        local_d0 = local_8a0;
        if (local_8a0 == 0) {
          local_b4 = 0;
        }
        else {
          local_b4 = memcmp(local_d58,local_8a8,local_8a0);
        }
        bVar1 = local_b4 == 0;
      }
      if (bVar1) {
        Optional<const_char_*>::operator=(&OStack_d48,&local_8b8);
      }
    }
    StringLiteral::StringLiteral<5UL>(&local_db8,(char (*) [5])"7447");
    local_8e8 = local_db8.super_StringRef.Data;
    local_8e0 = local_db8.super_StringRef.Length;
    local_8f8 = "7400";
    local_8f0 = &local_d58;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
    if (!bVar1) {
      local_908 = local_d58;
      local_900 = local_d50;
      local_918 = local_8e8;
      local_910 = local_8e0;
      local_6f0 = local_8e8;
      local_6e8 = local_8e0;
      local_700 = local_8e8;
      local_6f8 = local_8e0;
      local_118 = local_8e8;
      local_110 = local_8e0;
      local_120 = &local_6e0;
      bVar1 = false;
      local_6e0 = local_908;
      local_6d8 = local_900;
      if (local_d50 == local_8e0) {
        local_f8 = local_d58;
        local_100 = local_8e8;
        local_108 = local_8e0;
        if (local_8e0 == 0) {
          local_ec = 0;
        }
        else {
          local_ec = memcmp(local_d58,local_8e8,local_8e0);
        }
        bVar1 = local_ec == 0;
      }
      if (bVar1) {
        Optional<const_char_*>::operator=(&OStack_d48,&local_8f8);
      }
    }
    StringLiteral::StringLiteral<5UL>(&local_dc8,(char (*) [5])"7455");
    local_928 = local_dc8.super_StringRef.Data;
    local_920 = local_dc8.super_StringRef.Length;
    local_938 = "7450";
    local_930 = &local_d58;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
    if (!bVar1) {
      local_948 = local_d58;
      local_940 = local_d50;
      local_958 = local_928;
      local_950 = local_920;
      local_6c0 = local_928;
      local_6b8 = local_920;
      local_6d0 = local_928;
      local_6c8 = local_920;
      local_150 = local_928;
      local_148 = local_920;
      local_158 = &local_6b0;
      bVar1 = false;
      local_6b0 = local_948;
      local_6a8 = local_940;
      if (local_d50 == local_920) {
        local_130 = local_d58;
        local_138 = local_928;
        local_140 = local_920;
        if (local_920 == 0) {
          local_124 = 0;
        }
        else {
          local_124 = memcmp(local_d58,local_928,local_920);
        }
        bVar1 = local_124 == 0;
      }
      if (bVar1) {
        Optional<const_char_*>::operator=(&OStack_d48,&local_938);
      }
    }
    StringLiteral::StringLiteral<3UL>(&local_dd8,(char (*) [3])"G4");
    local_968 = local_dd8.super_StringRef.Data;
    local_960 = local_dd8.super_StringRef.Length;
    local_978 = "g4";
    local_970 = &local_d58;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
    if (!bVar1) {
      local_988 = local_d58;
      local_980 = local_d50;
      local_998 = local_968;
      local_990 = local_960;
      local_690 = local_968;
      local_688 = local_960;
      local_6a0 = local_968;
      local_698 = local_960;
      local_188 = local_968;
      local_180 = local_960;
      local_190 = &local_680;
      bVar1 = false;
      local_680 = local_988;
      local_678 = local_980;
      if (local_d50 == local_960) {
        local_168 = local_d58;
        local_170 = local_968;
        local_178 = local_960;
        if (local_960 == 0) {
          local_15c = 0;
        }
        else {
          local_15c = memcmp(local_d58,local_968,local_960);
        }
        bVar1 = local_15c == 0;
      }
      if (bVar1) {
        Optional<const_char_*>::operator=(&OStack_d48,&local_978);
      }
    }
    StringLiteral::StringLiteral<7UL>(&local_de8,(char (*) [7])"POWER4");
    local_9a8 = local_de8.super_StringRef.Data;
    local_9a0 = local_de8.super_StringRef.Length;
    local_9b8 = "970";
    local_9b0 = &local_d58;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
    if (!bVar1) {
      local_9c8 = local_d58;
      local_9c0 = local_d50;
      local_9d8 = local_9a8;
      local_9d0 = local_9a0;
      local_660 = local_9a8;
      local_658 = local_9a0;
      local_670 = local_9a8;
      local_668 = local_9a0;
      local_1c0 = local_9a8;
      local_1b8 = local_9a0;
      local_1c8 = &local_650;
      bVar1 = false;
      local_650 = local_9c8;
      local_648 = local_9c0;
      if (local_d50 == local_9a0) {
        local_1a0 = local_d58;
        local_1a8 = local_9a8;
        local_1b0 = local_9a0;
        if (local_9a0 == 0) {
          local_194 = 0;
        }
        else {
          local_194 = memcmp(local_d58,local_9a8,local_9a0);
        }
        bVar1 = local_194 == 0;
      }
      if (bVar1) {
        Optional<const_char_*>::operator=(&OStack_d48,&local_9b8);
      }
    }
    StringLiteral::StringLiteral<9UL>(&local_df8,(char (*) [9])"PPC970FX");
    local_9e8 = local_df8.super_StringRef.Data;
    local_9e0 = local_df8.super_StringRef.Length;
    local_9f8 = "970";
    local_9f0 = &local_d58;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
    if (!bVar1) {
      local_a08 = local_d58;
      local_a00 = local_d50;
      local_a18 = local_9e8;
      local_a10 = local_9e0;
      local_630 = local_9e8;
      local_628 = local_9e0;
      local_640 = local_9e8;
      local_638 = local_9e0;
      local_1f8 = local_9e8;
      local_1f0 = local_9e0;
      local_200 = &local_620;
      bVar1 = false;
      local_620 = local_a08;
      local_618 = local_a00;
      if (local_d50 == local_9e0) {
        local_1d8 = local_d58;
        local_1e0 = local_9e8;
        local_1e8 = local_9e0;
        if (local_9e0 == 0) {
          local_1cc = 0;
        }
        else {
          local_1cc = memcmp(local_d58,local_9e8,local_9e0);
        }
        bVar1 = local_1cc == 0;
      }
      if (bVar1) {
        Optional<const_char_*>::operator=(&OStack_d48,&local_9f8);
      }
    }
    StringLiteral::StringLiteral<9UL>(&local_e08,(char (*) [9])"PPC970MP");
    local_a28 = local_e08.super_StringRef.Data;
    local_a20 = local_e08.super_StringRef.Length;
    local_a38 = "970";
    local_a30 = &local_d58;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
    if (!bVar1) {
      local_a48 = local_d58;
      local_a40 = local_d50;
      local_a58 = local_a28;
      local_a50 = local_a20;
      local_600 = local_a28;
      local_5f8 = local_a20;
      local_610 = local_a28;
      local_608 = local_a20;
      local_230 = local_a28;
      local_228 = local_a20;
      local_238 = &local_5f0;
      bVar1 = false;
      local_5f0 = local_a48;
      local_5e8 = local_a40;
      if (local_d50 == local_a20) {
        local_210 = local_d58;
        local_218 = local_a28;
        local_220 = local_a20;
        if (local_a20 == 0) {
          local_204 = 0;
        }
        else {
          local_204 = memcmp(local_d58,local_a28,local_a20);
        }
        bVar1 = local_204 == 0;
      }
      if (bVar1) {
        Optional<const_char_*>::operator=(&OStack_d48,&local_a38);
      }
    }
    StringLiteral::StringLiteral<3UL>(&local_e18,(char (*) [3])"G5");
    local_a68 = local_e18.super_StringRef.Data;
    local_a60 = local_e18.super_StringRef.Length;
    local_a78 = "g5";
    local_a70 = &local_d58;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
    if (!bVar1) {
      local_a88 = local_d58;
      local_a80 = local_d50;
      local_a98 = local_a68;
      local_a90 = local_a60;
      local_5d0 = local_a68;
      local_5c8 = local_a60;
      local_5e0 = local_a68;
      local_5d8 = local_a60;
      local_268 = local_a68;
      local_260 = local_a60;
      local_270 = &local_5c0;
      bVar1 = false;
      local_5c0 = local_a88;
      local_5b8 = local_a80;
      if (local_d50 == local_a60) {
        local_248 = local_d58;
        local_250 = local_a68;
        local_258 = local_a60;
        if (local_a60 == 0) {
          local_23c = 0;
        }
        else {
          local_23c = memcmp(local_d58,local_a68,local_a60);
        }
        bVar1 = local_23c == 0;
      }
      if (bVar1) {
        Optional<const_char_*>::operator=(&OStack_d48,&local_a78);
      }
    }
    StringLiteral::StringLiteral<7UL>(&local_e28,(char (*) [7])"POWER5");
    local_aa8 = local_e28.super_StringRef.Data;
    local_aa0 = local_e28.super_StringRef.Length;
    local_ab8 = "g5";
    local_ab0 = &local_d58;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
    if (!bVar1) {
      local_ac8 = local_d58;
      local_ac0 = local_d50;
      local_ad8 = local_aa8;
      local_ad0 = local_aa0;
      local_5a0 = local_aa8;
      local_598 = local_aa0;
      local_5b0 = local_aa8;
      local_5a8 = local_aa0;
      local_2a0 = local_aa8;
      local_298 = local_aa0;
      local_2a8 = &local_590;
      bVar1 = false;
      local_590 = local_ac8;
      local_588 = local_ac0;
      if (local_d50 == local_aa0) {
        local_280 = local_d58;
        local_288 = local_aa8;
        local_290 = local_aa0;
        if (local_aa0 == 0) {
          local_274 = 0;
        }
        else {
          local_274 = memcmp(local_d58,local_aa8,local_aa0);
        }
        bVar1 = local_274 == 0;
      }
      if (bVar1) {
        Optional<const_char_*>::operator=(&OStack_d48,&local_ab8);
      }
    }
    StringLiteral::StringLiteral<3UL>(&local_e38,(char (*) [3])"A2");
    local_ae8 = local_e38.super_StringRef.Data;
    local_ae0 = local_e38.super_StringRef.Length;
    local_af8 = "a2";
    local_af0 = &local_d58;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
    if (!bVar1) {
      local_b08 = local_d58;
      local_b00 = local_d50;
      local_b18 = local_ae8;
      local_b10 = local_ae0;
      local_570 = local_ae8;
      local_568 = local_ae0;
      local_580 = local_ae8;
      local_578 = local_ae0;
      local_2d8 = local_ae8;
      local_2d0 = local_ae0;
      local_2e0 = &local_560;
      bVar1 = false;
      local_560 = local_b08;
      local_558 = local_b00;
      if (local_d50 == local_ae0) {
        local_2b8 = local_d58;
        local_2c0 = local_ae8;
        local_2c8 = local_ae0;
        if (local_ae0 == 0) {
          local_2ac = 0;
        }
        else {
          local_2ac = memcmp(local_d58,local_ae8,local_ae0);
        }
        bVar1 = local_2ac == 0;
      }
      if (bVar1) {
        Optional<const_char_*>::operator=(&OStack_d48,&local_af8);
      }
    }
    StringLiteral::StringLiteral<7UL>(&local_e48,(char (*) [7])"POWER6");
    local_b28 = local_e48.super_StringRef.Data;
    local_b20 = local_e48.super_StringRef.Length;
    local_b38 = "pwr6";
    local_b30 = &local_d58;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
    if (!bVar1) {
      local_b48 = local_d58;
      local_b40 = local_d50;
      local_b58 = local_b28;
      local_b50 = local_b20;
      local_540 = local_b28;
      local_538 = local_b20;
      local_550 = local_b28;
      local_548 = local_b20;
      local_310 = local_b28;
      local_308 = local_b20;
      local_318 = &local_530;
      bVar1 = false;
      local_530 = local_b48;
      local_528 = local_b40;
      if (local_d50 == local_b20) {
        local_2f0 = local_d58;
        local_2f8 = local_b28;
        local_300 = local_b20;
        if (local_b20 == 0) {
          local_2e4 = 0;
        }
        else {
          local_2e4 = memcmp(local_d58,local_b28,local_b20);
        }
        bVar1 = local_2e4 == 0;
      }
      if (bVar1) {
        Optional<const_char_*>::operator=(&OStack_d48,&local_b38);
      }
    }
    StringLiteral::StringLiteral<7UL>(&local_e58,(char (*) [7])"POWER7");
    local_b68 = local_e58.super_StringRef.Data;
    local_b60 = local_e58.super_StringRef.Length;
    local_b78 = "pwr7";
    local_b70 = &local_d58;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
    if (!bVar1) {
      local_b88 = local_d58;
      local_b80 = local_d50;
      local_b98 = local_b68;
      local_b90 = local_b60;
      local_510 = local_b68;
      local_508 = local_b60;
      local_520 = local_b68;
      local_518 = local_b60;
      local_348 = local_b68;
      local_340 = local_b60;
      local_350 = &local_500;
      bVar1 = false;
      local_500 = local_b88;
      local_4f8 = local_b80;
      if (local_d50 == local_b60) {
        local_328 = local_d58;
        local_330 = local_b68;
        local_338 = local_b60;
        if (local_b60 == 0) {
          local_31c = 0;
        }
        else {
          local_31c = memcmp(local_d58,local_b68,local_b60);
        }
        bVar1 = local_31c == 0;
      }
      if (bVar1) {
        Optional<const_char_*>::operator=(&OStack_d48,&local_b78);
      }
    }
    StringLiteral::StringLiteral<7UL>(&local_e68,(char (*) [7])"POWER8");
    local_ba8 = local_e68.super_StringRef.Data;
    local_ba0 = local_e68.super_StringRef.Length;
    local_bb8 = "pwr8";
    local_bb0 = &local_d58;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
    if (!bVar1) {
      local_bc8 = local_d58;
      local_bc0 = local_d50;
      local_bd8 = local_ba8;
      local_bd0 = local_ba0;
      local_4e0 = local_ba8;
      local_4d8 = local_ba0;
      local_4f0 = local_ba8;
      local_4e8 = local_ba0;
      local_380 = local_ba8;
      local_378 = local_ba0;
      local_388 = &local_4d0;
      bVar1 = false;
      local_4d0 = local_bc8;
      local_4c8 = local_bc0;
      if (local_d50 == local_ba0) {
        local_360 = local_d58;
        local_368 = local_ba8;
        local_370 = local_ba0;
        if (local_ba0 == 0) {
          local_354 = 0;
        }
        else {
          local_354 = memcmp(local_d58,local_ba8,local_ba0);
        }
        bVar1 = local_354 == 0;
      }
      if (bVar1) {
        Optional<const_char_*>::operator=(&OStack_d48,&local_bb8);
      }
    }
    StringLiteral::StringLiteral<8UL>(&local_e78,(char (*) [8])"POWER8E");
    local_be8 = local_e78.super_StringRef.Data;
    local_be0 = local_e78.super_StringRef.Length;
    local_bf8 = "pwr8";
    local_bf0 = &local_d58;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
    if (!bVar1) {
      local_c08 = local_d58;
      local_c00 = local_d50;
      local_c18 = local_be8;
      local_c10 = local_be0;
      local_4b0 = local_be8;
      local_4a8 = local_be0;
      local_4c0 = local_be8;
      local_4b8 = local_be0;
      local_3b8 = local_be8;
      local_3b0 = local_be0;
      local_3c0 = &local_4a0;
      bVar1 = false;
      local_4a0 = local_c08;
      local_498 = local_c00;
      if (local_d50 == local_be0) {
        local_398 = local_d58;
        local_3a0 = local_be8;
        local_3a8 = local_be0;
        if (local_be0 == 0) {
          local_38c = 0;
        }
        else {
          local_38c = memcmp(local_d58,local_be8,local_be0);
        }
        bVar1 = local_38c == 0;
      }
      if (bVar1) {
        Optional<const_char_*>::operator=(&OStack_d48,&local_bf8);
      }
    }
    StringLiteral::StringLiteral<10UL>(&local_e88,(char (*) [10])"POWER8NVL");
    local_c28 = local_e88.super_StringRef.Data;
    local_c20 = local_e88.super_StringRef.Length;
    local_c38 = "pwr8";
    local_c30 = &local_d58;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
    if (!bVar1) {
      local_c48 = local_d58;
      local_c40 = local_d50;
      local_c58 = local_c28;
      local_c50 = local_c20;
      local_480 = local_c28;
      local_478 = local_c20;
      local_490 = local_c28;
      local_488 = local_c20;
      local_3f0 = local_c28;
      local_3e8 = local_c20;
      local_3f8 = &local_470;
      bVar1 = false;
      local_470 = local_c48;
      local_468 = local_c40;
      if (local_d50 == local_c20) {
        local_3d0 = local_d58;
        local_3d8 = local_c28;
        local_3e0 = local_c20;
        if (local_c20 == 0) {
          local_3c4 = 0;
        }
        else {
          local_3c4 = memcmp(local_d58,local_c28,local_c20);
        }
        bVar1 = local_3c4 == 0;
      }
      if (bVar1) {
        Optional<const_char_*>::operator=(&OStack_d48,&local_c38);
      }
    }
    StringLiteral::StringLiteral<7UL>(&local_e98,(char (*) [7])"POWER9");
    local_c68 = local_e98.super_StringRef.Data;
    local_c60 = local_e98.super_StringRef.Length;
    local_c78 = "pwr9";
    local_c70 = &local_d58;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
    if (!bVar1) {
      local_440 = local_d58;
      local_438 = local_d50;
      local_450 = local_c68;
      local_448 = local_c60;
      local_460 = local_c68;
      local_458 = local_c60;
      local_428 = local_c68;
      local_420 = local_c60;
      local_430 = &local_440;
      bVar1 = false;
      if (local_d50 == local_c60) {
        local_408 = local_d58;
        local_410 = local_c68;
        local_418 = local_c60;
        if (local_c60 == 0) {
          local_3fc = 0;
        }
        else {
          local_3fc = memcmp(local_d58,local_c68,local_c60);
        }
        bVar1 = local_3fc == 0;
      }
      if (bVar1) {
        Optional<const_char_*>::operator=(&OStack_d48,&local_c78);
      }
    }
    local_7d8 = CPUInfoStart;
    local_7d0 = &local_d58;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_d48);
    if (bVar1) {
      ppcVar3 = Optional<const_char_*>::operator*(&OStack_d48);
      local_7c8 = *ppcVar3;
    }
    else {
      local_7c8 = local_7d8;
    }
    ProcCpuinfoContent_local.Length = (size_t)local_7c8;
    if (local_7c8 != (char *)0x0) {
      strlen(local_7c8);
    }
  }
  return stack0xfffffffffffff308;
}

Assistant:

StringRef sys::detail::getHostCPUNameForPowerPC(StringRef ProcCpuinfoContent) {
  // Access to the Processor Version Register (PVR) on PowerPC is privileged,
  // and so we must use an operating-system interface to determine the current
  // processor type. On Linux, this is exposed through the /proc/cpuinfo file.
  const char *generic = "generic";

  // The cpu line is second (after the 'processor: 0' line), so if this
  // buffer is too small then something has changed (or is wrong).
  StringRef::const_iterator CPUInfoStart = ProcCpuinfoContent.begin();
  StringRef::const_iterator CPUInfoEnd = ProcCpuinfoContent.end();

  StringRef::const_iterator CIP = CPUInfoStart;

  StringRef::const_iterator CPUStart = 0;
  size_t CPULen = 0;

  // We need to find the first line which starts with cpu, spaces, and a colon.
  // After the colon, there may be some additional spaces and then the cpu type.
  while (CIP < CPUInfoEnd && CPUStart == 0) {
    if (CIP < CPUInfoEnd && *CIP == '\n')
      ++CIP;

    if (CIP < CPUInfoEnd && *CIP == 'c') {
      ++CIP;
      if (CIP < CPUInfoEnd && *CIP == 'p') {
        ++CIP;
        if (CIP < CPUInfoEnd && *CIP == 'u') {
          ++CIP;
          while (CIP < CPUInfoEnd && (*CIP == ' ' || *CIP == '\t'))
            ++CIP;

          if (CIP < CPUInfoEnd && *CIP == ':') {
            ++CIP;
            while (CIP < CPUInfoEnd && (*CIP == ' ' || *CIP == '\t'))
              ++CIP;

            if (CIP < CPUInfoEnd) {
              CPUStart = CIP;
              while (CIP < CPUInfoEnd && (*CIP != ' ' && *CIP != '\t' &&
                                          *CIP != ',' && *CIP != '\n'))
                ++CIP;
              CPULen = CIP - CPUStart;
            }
          }
        }
      }
    }

    if (CPUStart == 0)
      while (CIP < CPUInfoEnd && *CIP != '\n')
        ++CIP;
  }

  if (CPUStart == 0)
    return generic;

  return StringSwitch<const char *>(StringRef(CPUStart, CPULen))
      .Case("604e", "604e")
      .Case("604", "604")
      .Case("7400", "7400")
      .Case("7410", "7400")
      .Case("7447", "7400")
      .Case("7455", "7450")
      .Case("G4", "g4")
      .Case("POWER4", "970")
      .Case("PPC970FX", "970")
      .Case("PPC970MP", "970")
      .Case("G5", "g5")
      .Case("POWER5", "g5")
      .Case("A2", "a2")
      .Case("POWER6", "pwr6")
      .Case("POWER7", "pwr7")
      .Case("POWER8", "pwr8")
      .Case("POWER8E", "pwr8")
      .Case("POWER8NVL", "pwr8")
      .Case("POWER9", "pwr9")
      .Default(generic);
}